

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

void __thiscall
dmlc::JSONWriter::
WriteObjectKeyValue<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (JSONWriter *this,string *key,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *value)

{
  pointer puVar1;
  ostream *poVar2;
  pointer pcVar3;
  char local_49;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  if ((this->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1] != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(this->os_,", ",2);
  }
  WriteSeperator(this);
  local_49 = '\"';
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,&local_49,1);
  poVar2 = this->os_;
  pcVar3 = (key->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar3,pcVar3 + key->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_48,local_40);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"\": ",3);
  puVar1 = (this->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1;
  *puVar1 = *puVar1 + 1;
  json::
  ArrayHandler<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::Write(this,value);
  return;
}

Assistant:

inline void JSONWriter::WriteObjectKeyValue(const std::string &key,
                                            const ValueType &value) {
  if (scope_counter_.back() > 0) {
    Extend(os_, ", ");
  }
  WriteSeperator();
  Extend(os_, '\"');
  Extend(os_, key);
  Extend(os_, "\": ");
  scope_counter_.back() += 1;
  json::Handler<ValueType>::Write(this, value);
}